

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

Vec_Int_t * Saig_StrSimPerformMatching_hack(Aig_Man_t *p0,Aig_Man_t *p1)

{
  void *pvVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  long lVar5;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  pVVar3 = p0->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      if (pvVar1 != (void *)0x0) {
        if (((ulong)pvVar1 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
        }
        uVar4 = (uint)*(undefined8 *)((long)pvVar1 + 0x18);
        if (((ulong)(uVar4 & 7) - 1 < 2) || (0xfffffffd < (uVar4 & 7) - 7)) {
          Vec_IntPush(p,(int)lVar5);
          Vec_IntPush(p,(int)lVar5);
          pVVar3 = p0->vObjs;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar3->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Saig_StrSimPerformMatching_hack( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Int_t * vPairs;
    Aig_Obj_t * pObj;
    int i;
    // create array of pairs
    vPairs = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsConst1(pObj) && !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_IntPush( vPairs, i );
        Vec_IntPush( vPairs, i );
    }
    return vPairs;
}